

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O2

int __thiscall ComplexType::serialise(ComplexType *this,uint8_t *buf,size_t max_len)

{
  pointer psVar1;
  element_type *peVar2;
  uint uVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t uVar6;
  uint uVar7;
  long lVar8;
  pointer psVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  
  iVar4 = -0x1f;
  if (1 < max_len) {
    *buf = (char)(this->super_BER_CONTAINER)._type;
    puVar10 = buf + 1;
    puVar5 = buf + 2;
    psVar1 = (this->values).
             super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = 0;
    puVar11 = puVar5;
    for (psVar9 = (this->values).
                  super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar1; psVar9 = psVar9 + 1)
    {
      peVar2 = (psVar9->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        return -0x20;
      }
      uVar3 = (*peVar2->_vptr_BER_CONTAINER[2])(peVar2,puVar11,(long)(int)~uVar7 + max_len);
      if ((int)uVar3 < 0) {
        return uVar3;
      }
      uVar7 = uVar7 + uVar3;
      puVar11 = puVar11 + uVar3;
    }
    lVar8 = 1;
    if (0x7f < uVar7) {
      lVar8 = 3 - (ulong)(uVar7 < 0x101);
    }
    iVar4 = -0x1f;
    if ((ulong)uVar7 + lVar8 + 1 <= max_len) {
      uVar3 = uVar7;
      if (uVar7 < 0x80) {
        iVar4 = 2;
      }
      else {
        while( true ) {
          uVar3 = uVar3 - 1;
          if ((int)uVar3 < 0) break;
          puVar5[(int)(uVar3 + (int)lVar8 + -1)] = puVar5[uVar3];
        }
        if (uVar7 < 0x101) {
          iVar4 = 3;
          uVar6 = 0x81;
        }
        else {
          buf[2] = (uint8_t)(uVar7 >> 8);
          puVar5 = buf + 3;
          iVar4 = 4;
          uVar6 = 0x82;
        }
        *puVar10 = uVar6;
        puVar10 = puVar5;
      }
      *puVar10 = (uint8_t)uVar7;
      iVar4 = iVar4 + uVar7;
    }
  }
  return iVar4;
}

Assistant:

int ComplexType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len);
    CHECK_ENCODE_ERR(i);

    uint8_t* ptr = buf + i;
    uint8_t* len_ptr = ptr++;

    uint8_t* internalPtr = ptr; // This is V*

    int internalLength = 0;

    for(const auto& item : values){
        if(!item) return SNMP_BUFFER_ENCODE_ERROR_INVALID_ITEM;
        int length = item->serialise(internalPtr, max_len - internalLength - 1);
        if(length < 0){
            SNMP_LOGD("Item failed to serialiseInto: %d, reason: %d\n", item->_type, length);
            CHECK_ENCODE_ERR(length);
        }
        internalPtr += length;
        internalLength += length;
    }

    int num_length_bytes = encode_ber_length_integer_count(internalLength);
    if(max_len < (size_t)i + internalLength + num_length_bytes) return SNMP_BUFFER_ENCODE_ERR_LEN_EXCEEDED;
    if(num_length_bytes > 1){
        shift_arr_right(ptr, num_length_bytes-1, internalLength);
    }

    // then write the length value
    i += encode_ber_length_integer(len_ptr, internalLength, num_length_bytes); // , max_len_bytes just to be safe
    return internalLength + i;
}